

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O3

uint __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_int>,unsigned_int>
          (STObject *this,SField *field)

{
  STBase *pSVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  iVar2 = getFieldIndex(this,field);
  if (iVar2 != -1) {
    pSVar1 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2].p_;
    if (pSVar1 != (STBase *)0x0) {
      iVar2 = (*pSVar1->_vptr_STBase[4])(pSVar1);
      if (iVar2 == 0) {
        uVar3 = 0;
      }
      else {
        lVar4 = __dynamic_cast(pSVar1,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
        if (lVar4 == 0) {
          Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
        }
        uVar3 = *(uint *)(lVar4 + 0x10);
      }
      return uVar3;
    }
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }